

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O3

links_entry_conflict * next_entry(archive_entry_linkresolver *res,int mode)

{
  links_entry_conflict **pplVar1;
  links_entry_conflict *plVar2;
  links_entry_conflict *plVar3;
  links_entry_conflict *plVar4;
  links_entry_conflict *plVar5;
  size_t sVar6;
  bool bVar7;
  
  if (res->spare != (links_entry_conflict *)0x0) {
    archive_entry_free(res->spare->canonical);
    archive_entry_free(res->spare->entry);
    free(res->spare);
    res->spare = (links_entry_conflict *)0x0;
  }
  if (res->number_buckets != 0) {
    pplVar1 = res->buckets;
    sVar6 = 0;
    do {
      for (plVar4 = pplVar1[sVar6]; plVar4 != (links_entry_conflict *)0x0; plVar4 = plVar4->next) {
        bVar7 = plVar4->entry != (archive_entry *)0x0;
        if (((mode & 1U) != 0 || !bVar7) && ((mode & 2U) != 0 || bVar7)) {
          plVar2 = plVar4->next;
          plVar3 = plVar4->previous;
          if (plVar2 != (links_entry_conflict *)0x0) {
            plVar2->previous = plVar3;
          }
          plVar5 = (links_entry_conflict *)(pplVar1 + sVar6);
          if (plVar3 != (links_entry_conflict *)0x0) {
            plVar5 = plVar3;
          }
          plVar5->next = plVar2;
          res->number_entries = res->number_entries - 1;
          res->spare = plVar4;
          return plVar4;
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != res->number_buckets);
  }
  return (links_entry_conflict *)0x0;
}

Assistant:

static struct links_entry *
next_entry(struct archive_entry_linkresolver *res, int mode)
{
	struct links_entry	*le;
	size_t			 bucket;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	/* Look for next non-empty bucket in the links cache. */
	for (bucket = 0; bucket < res->number_buckets; bucket++) {
		for (le = res->buckets[bucket]; le != NULL; le = le->next) {
			if (le->entry != NULL &&
			    (mode & NEXT_ENTRY_DEFERRED) == 0)
				continue;
			if (le->entry == NULL &&
			    (mode & NEXT_ENTRY_PARTIAL) == 0)
				continue;
			/* Remove it from this hash bucket. */
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (le->previous != NULL)
				le->previous->next = le->next;
			else
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}